

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

QThreadPool * QThreadPool::globalInstance(void)

{
  bool bVar1;
  int iVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalInstance()::theInstance == '\0') &&
     (iVar2 = __cxa_guard_acquire(&globalInstance()::theInstance), iVar2 != 0)) {
    __cxa_atexit(QPointer<QThreadPool>::~QPointer,&globalInstance::theInstance,&__dso_handle);
    __cxa_guard_release(&globalInstance()::theInstance);
  }
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = &globalInstance::theMutex;
  QBasicMutex::lock(&globalInstance::theMutex);
  local_28[8] = true;
  bVar1 = QWeakPointer<QObject>::isNull(&globalInstance::theInstance.wp);
  if ((bVar1) && (bVar1 = QCoreApplication::closingDown(), !bVar1)) {
    pQVar3 = (QObject *)operator_new(0x10);
    QThreadPool((QThreadPool *)pQVar3,(QObject *)0x0);
    QWeakPointer<QObject>::assign<QObject>(&globalInstance::theInstance.wp,pQVar3);
  }
  if ((globalInstance::theInstance.wp.d == (Data *)0x0) ||
     (pQVar3 = globalInstance::theInstance.wp.value,
     ((globalInstance::theInstance.wp.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (QThreadPool *)pQVar3;
}

Assistant:

QThreadPool *QThreadPool::globalInstance()
{
    Q_CONSTINIT static QPointer<QThreadPool> theInstance;
    Q_CONSTINIT static QBasicMutex theMutex;

    const QMutexLocker locker(&theMutex);
    if (theInstance.isNull() && !QCoreApplication::closingDown())
        theInstance = new QThreadPool();
    return theInstance;
}